

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O1

void Msat_OrderVarUnassigned(Msat_Order_t *p,int Var)

{
  Msat_IntVec_t *p_00;
  int iVar1;
  long lVar2;
  long lVar3;
  timespec ts;
  timespec local_30;
  
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  if (-1 < Var) {
    if ((p->vIndex->nSize <= Var) || (p->vIndex->pArray[(uint)Var] == 0)) {
      if ((Var < 0) || (p->vIndex->nSize <= Var)) goto LAB_0092b669;
      p_00 = p->vHeap;
      p->vIndex->pArray[(uint)Var] = p_00->nSize;
      Msat_IntVecPush(p_00,Var);
      Msat_HeapPercolateUp(p,p->vIndex->pArray[(uint)Var]);
    }
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    timeSelect = timeSelect + lVar3 + lVar2;
    return;
  }
LAB_0092b669:
  __assert_fail("HOKAY(p, n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatOrderH.c"
                ,0x14b,"void Msat_HeapInsert(Msat_Order_t *, int)");
}

Assistant:

void Msat_OrderVarUnassigned( Msat_Order_t * p, int Var )
{
//    if (!heap.inHeap(x))
//        heap.insert(x);

    abctime clk = Abc_Clock();
    if ( !HINHEAP(p,Var) )
        Msat_HeapInsert( p, Var );
timeSelect += Abc_Clock() - clk;
}